

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void draw_rectangle(chunk_conflict *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat,
                   wchar_t flag,_Bool overwrite_perm)

{
  _Bool _Var1;
  loc_conflict lVar2;
  undefined4 local_30;
  undefined4 local_2c;
  wchar_t x;
  wchar_t y;
  _Bool overwrite_perm_local;
  wchar_t feat_local;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  chunk_conflict *c_local;
  
  for (local_2c = y1; local_2c <= y2; local_2c = local_2c + L'\x01') {
    if (overwrite_perm) {
LAB_00168e3c:
      lVar2 = (loc_conflict)loc(x1,local_2c);
      square_set_feat((chunk *)c,lVar2,feat);
    }
    else {
      lVar2 = (loc_conflict)loc(x1,local_2c);
      _Var1 = square_isperm((chunk *)c,lVar2);
      if (!_Var1) goto LAB_00168e3c;
    }
    if (overwrite_perm) {
LAB_00168e91:
      lVar2 = (loc_conflict)loc(x2,local_2c);
      square_set_feat((chunk *)c,lVar2,feat);
    }
    else {
      lVar2 = (loc_conflict)loc(x2,local_2c);
      _Var1 = square_isperm((chunk *)c,lVar2);
      if (!_Var1) goto LAB_00168e91;
    }
  }
  local_30 = x1;
  if (flag != L'\0') {
    generate_mark(c,y1,x1,y2,x1,flag);
    generate_mark(c,y1,x2,y2,x2,flag);
  }
  do {
    if (x2 < local_30) {
      if (flag != L'\0') {
        generate_mark(c,y1,x1,y1,x2,flag);
        generate_mark(c,y2,x1,y2,x2,flag);
      }
      return;
    }
    if (overwrite_perm) {
LAB_00168f4e:
      lVar2 = (loc_conflict)loc(local_30,y1);
      square_set_feat((chunk *)c,lVar2,feat);
    }
    else {
      lVar2 = (loc_conflict)loc(local_30,y1);
      _Var1 = square_isperm((chunk *)c,lVar2);
      if (!_Var1) goto LAB_00168f4e;
    }
    if (overwrite_perm) {
LAB_00168faf:
      lVar2 = (loc_conflict)loc(local_30,y2);
      square_set_feat((chunk *)c,lVar2,feat);
    }
    else {
      lVar2 = (loc_conflict)loc(local_30,y2);
      _Var1 = square_isperm((chunk *)c,lVar2);
      if (!_Var1) goto LAB_00168faf;
    }
    local_30 = local_30 + L'\x01';
  } while( true );
}

Assistant:

void draw_rectangle(struct chunk *c, int y1, int x1, int y2, int x2, int feat,
					int flag, bool overwrite_perm)
{
	int y, x;

	for (y = y1; y <= y2; y++) {
		if (overwrite_perm || !square_isperm(c, loc(x1, y))) {
			square_set_feat(c, loc(x1, y), feat);
		}
		if (overwrite_perm || !square_isperm(c, loc(x2, y))) {
			square_set_feat(c, loc(x2, y), feat);
		}
	}
	if (flag) {
		generate_mark(c, y1, x1, y2, x1, flag);
		generate_mark(c, y1, x2, y2, x2, flag);
	}
	for (x = x1; x <= x2; x++) {
		if (overwrite_perm || !square_isperm(c, loc(x, y1))) {
			square_set_feat(c, loc(x, y1), feat);
		}
		if (overwrite_perm || !square_isperm(c, loc(x, y2))) {
			square_set_feat(c, loc(x, y2), feat);
		}
	}
	if (flag) {
		generate_mark(c, y1, x1, y1, x2, flag);
		generate_mark(c, y2, x1, y2, x2, flag);
	}
}